

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O0

exr_result_t
exr_attr_list_find_by_name
          (exr_const_context_t ctxt,exr_attribute_list_t *list,char *name,exr_attribute_t **out)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 *in_RCX;
  char *in_RDX;
  int *in_RSI;
  long in_RDI;
  int cmp;
  int count;
  int step;
  exr_attribute_t **end;
  exr_attribute_t **first;
  exr_attribute_t **it;
  int local_48;
  undefined8 *local_38;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else if (in_RCX == (undefined8 *)0x0) {
    local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Invalid output pointer passed to find_by_name")
    ;
  }
  else if ((in_RDX == (char *)0x0) || (*in_RDX == '\0')) {
    local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Invalid name passed to find_by_name");
  }
  else if (in_RSI == (int *)0x0) {
    local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Invalid list pointer passed to find_by_name");
  }
  else {
    if (*(long *)(in_RSI + 4) != 0) {
      local_38 = *(undefined8 **)(in_RSI + 4);
      puVar3 = local_38 + *in_RSI;
      iVar1 = *in_RSI;
      while (local_48 = iVar1, 0 < local_48) {
        iVar1 = local_48 / 2;
        puVar4 = local_38 + iVar1;
        iVar2 = strcmp(*(char **)*puVar4,in_RDX);
        if (iVar2 == 0) {
          *in_RCX = *puVar4;
          return 0;
        }
        if (iVar2 < 0) {
          local_38 = puVar4 + 1;
          iVar1 = local_48 - (iVar1 + 1);
        }
      }
      if (((local_38 != (undefined8 *)0x0) && (local_38 < puVar3)) &&
         (iVar1 = strcmp(*(char **)*local_38,in_RDX), iVar1 == 0)) {
        *in_RCX = *local_38;
        return 0;
      }
    }
    local_4 = 0xf;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_list_find_by_name (
    exr_const_context_t   ctxt,
    exr_attribute_list_t* list,
    const char*           name,
    exr_attribute_t**     out)
{
    exr_attribute_t** it    = NULL;
    exr_attribute_t** first = NULL;
    exr_attribute_t** end   = NULL;
    int               step, count, cmp;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!out)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid output pointer passed to find_by_name");

    if (!name || name[0] == '\0')
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid name passed to find_by_name");

    if (!list)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid list pointer passed to find_by_name");

    if (list->sorted_entries)
    {
        first = list->sorted_entries;
        count = list->num_attributes;
        end   = first + count;
        /* lower bound search w/ equality check */
        while (count > 0)
        {
            it   = first;
            step = count / 2;
            it += step;
            cmp = strcmp ((*it)->name, name);
            if (cmp == 0)
            {
                // early exit
                *out = (*it);
                return EXR_ERR_SUCCESS;
            }

            if (cmp < 0)
            {
                first = ++it;
                count -= step + 1;
            }
            else
                count = step;
        }

        if (first && first < end && 0 == strcmp ((*first)->name, name))
        {
            *out = (*first);
            return EXR_ERR_SUCCESS;
        }
    }

    return EXR_ERR_NO_ATTR_BY_NAME;
}